

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsTTDCreateRecordRuntime
          (JsRuntimeAttributes attributes,bool enableDebugging,size_t snapInterval,
          size_t snapHistoryLength,TTDOpenResourceStreamCallback openResourceStream,
          JsTTDWriteBytesToStreamCallback writeBytesToStream,
          JsTTDFlushAndCloseStreamCallback flushAndCloseStream,JsThreadServiceCallback threadService
          ,JsRuntimeHandle *runtime)

{
  JsErrorCode JVar1;
  
  if ((snapHistoryLength | snapInterval) >> 0x20 == 0) {
    JVar1 = CreateRuntimeCore(attributes,(char *)0x0,0,true,false,enableDebugging,
                              (UINT32)snapInterval,(UINT32)snapHistoryLength,openResourceStream,
                              (JsTTDReadBytesFromStreamCallback)0x0,writeBytesToStream,
                              flushAndCloseStream,threadService,runtime);
    return JVar1;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsTTDCreateRecordRuntime(_In_ JsRuntimeAttributes attributes, _In_ bool enableDebugging, _In_ size_t snapInterval, _In_ size_t snapHistoryLength,
    _In_ TTDOpenResourceStreamCallback openResourceStream, _In_ JsTTDWriteBytesToStreamCallback writeBytesToStream, _In_ JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
    _In_opt_ JsThreadServiceCallback threadService, _Out_ JsRuntimeHandle *runtime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    if(snapInterval > UINT32_MAX || snapHistoryLength > UINT32_MAX)
    {
        return JsErrorInvalidArgument;
    }

    return CreateRuntimeCore(attributes, nullptr, 0, true, false, enableDebugging, (uint32)snapInterval, (uint32)snapHistoryLength,
        openResourceStream, nullptr, writeBytesToStream, flushAndCloseStream,
        threadService, runtime);
#endif
}